

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

void __thiscall diy::FileStorage::~FileStorage(FileStorage *this)

{
  CriticalMap *this_00;
  _Rep_type *p_Var1;
  _Rb_tree_node_base *p_Var2;
  const_accessor local_48;
  
  (this->super_ExternalStorage)._vptr_ExternalStorage = (_func_int **)&PTR_put_0014f1a8;
  this_00 = &this->filenames_;
  critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  ::const_access(&local_48,this_00);
  p_Var2 = ((local_48.x_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  std::unique_lock<tthread::fast_mutex>::~unique_lock(&local_48.lock_);
  while( true ) {
    critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
    ::const_access(&local_48,this_00);
    p_Var1 = &(local_48.x_)->_M_t;
    std::unique_lock<tthread::fast_mutex>::~unique_lock(&local_48.lock_);
    if ((_Rb_tree_header *)p_Var2 == &(p_Var1->_M_impl).super__Rb_tree_header) break;
    io::utils::remove((char *)&p_Var2[1]._M_left);
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_diy::FileStorage::FileRecord>,_std::_Select1st<std::pair<const_int,_diy::FileStorage::FileRecord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_diy::FileStorage::FileRecord>,_std::_Select1st<std::pair<const_int,_diy::FileStorage::FileRecord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
               *)this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->filename_templates_);
  return;
}

Assistant:

~FileStorage()
      {
        for (FileRecordMap::const_iterator it =  filenames_.const_access()->begin();
                                           it != filenames_.const_access()->end();
                                         ++it)
        {
          io::utils::remove(it->second.name);
        }
      }